

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curi.c
# Opt level: O0

curi_status parse_pchar(char *uri,size_t len,size_t *offset,curi_settings *settings,void *userData)

{
  char *pcVar1;
  void *userData_local;
  curi_settings *settings_local;
  size_t *offset_local;
  size_t len_local;
  char *uri_local;
  
  pcVar1 = read_char(uri,len,offset);
  switch(*pcVar1) {
  case '!':
  case '$':
  case '&':
  case '\'':
  case '(':
  case ')':
  case '*':
  case '+':
  case ',':
  case '-':
  case '.':
  case '0':
  case '1':
  case '2':
  case '3':
  case '4':
  case '5':
  case '6':
  case '7':
  case '8':
  case '9':
  case ':':
  case ';':
  case '=':
  case '@':
  case 'A':
  case 'B':
  case 'C':
  case 'D':
  case 'E':
  case 'F':
  case 'G':
  case 'H':
  case 'I':
  case 'J':
  case 'K':
  case 'L':
  case 'M':
  case 'N':
  case 'O':
  case 'P':
  case 'Q':
  case 'R':
  case 'S':
  case 'T':
  case 'U':
  case 'V':
  case 'W':
  case 'X':
  case 'Y':
  case 'Z':
  case '_':
  case 'a':
  case 'b':
  case 'c':
  case 'd':
  case 'e':
  case 'f':
  case 'g':
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'o':
  case 'p':
  case 'q':
  case 'r':
  case 's':
  case 't':
  case 'u':
  case 'v':
  case 'w':
  case 'x':
  case 'y':
  case 'z':
  case '~':
    uri_local._4_4_ = curi_status_success;
    break;
  default:
    uri_local._4_4_ = curi_status_error;
    break;
  case '%':
    uri_local._4_4_ = parse_h8(uri,len,offset,settings,userData);
  }
  return uri_local._4_4_;
}

Assistant:

static curi_status parse_pchar(const char* uri, size_t len, size_t* offset, const curi_settings* settings, void* userData)
{
    // pchar = unreserved / "%" h8 / sub-delims / ":" / "@"
    switch (*read_char(uri,len,offset))
    {
        CASE_PCHAR_NO_PCT:
            return curi_status_success;
        case '%':
            return parse_h8(uri, len, offset, settings, userData);
        default:
            return curi_status_error;
    }
}